

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzverysparsematrix.cpp
# Opt level: O0

void __thiscall
TPZVerySparseMatrix<std::complex<double>_>::TPZVerySparseMatrix
          (TPZVerySparseMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *cp)

{
  complex<double> a_00;
  bool bVar1;
  long *in_RSI;
  TPZRegisterClassId *in_RDI;
  undefined8 in_XMM1_Qa;
  complex<double> a;
  int64_t j;
  int64_t i;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  void **in_stack_ffffffffffffff78;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffff80;
  undefined8 local_40 [2];
  long local_30;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  local_18 = 0;
  local_20 = 0x21;
  local_10 = in_RSI;
  TPZRegisterClassId::TPZRegisterClassId<TPZVerySparseMatrix<std::complex<double>>>(in_RDI,0x21);
  TPZMatrix<std::complex<double>_>::TPZMatrix
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (TPZMatrix<std::complex<double>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  *(undefined ***)in_RDI = &PTR__TPZVerySparseMatrix_0242fd90;
  std::
  map<std::pair<long,_long>,_std::complex<double>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<double>_>_>_>
  ::map((map<std::pair<long,_long>,_std::complex<double>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<double>_>_>_>
         *)0x1423809);
  for (local_28 = 0; local_28 < *(long *)(in_RDI + 8); local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < *(long *)(in_RDI + 0x10); local_30 = local_30 + 1) {
      local_40[0] = (**(code **)(*local_10 + 0x120))(local_10,local_28,local_30);
      a_00._M_value._8_8_ = local_40[0];
      a_00._M_value._0_8_ = in_XMM1_Qa;
      bVar1 = IsZero(a_00);
      if (!bVar1) {
        (**(code **)(*(long *)in_RDI + 0x118))(in_RDI,local_28,local_30,local_40);
      }
    }
  }
  return;
}

Assistant:

TPZVerySparseMatrix<TVar>::TPZVerySparseMatrix(const TPZFMatrix<TVar> &cp) : TPZRegisterClassId(&TPZVerySparseMatrix::ClassId),TPZMatrix<TVar>(cp)
{
	for(int64_t i=0; i<this->fRow; i++)
	{
		for(int64_t j=0; j<this->fCol; j++)
		{
			TVar a = cp.GetVal(i,j);
			if(!IsZero(a)) PutVal(i,j,a);
		}
	}
}